

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManOrigIdsInit(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p->vIdsOrig != (Vec_Int_t *)0x0) {
    piVar3 = p->vIdsOrig->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vIdsOrig->pArray = (int *)0x0;
    }
    if (p->vIdsOrig != (Vec_Int_t *)0x0) {
      free(p->vIdsOrig);
      p->vIdsOrig = (Vec_Int_t *)0x0;
    }
  }
  uVar1 = p->nObjs;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar4 = uVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar4;
  if (uVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)(int)uVar4 << 2);
  }
  pVVar2->pArray = piVar3;
  pVVar2->nSize = uVar1;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      piVar3[uVar5] = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  p->vIdsOrig = pVVar2;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Manipulating original IDs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManOrigIdsInit( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartNatural( Gia_ManObjNum(p) );
}